

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

lua_Unsigned lua_rawlen(lua_State *L,int idx)

{
  TValue *pTVar1;
  TValue *o;
  int idx_local;
  lua_State *L_local;
  
  pTVar1 = index2value(L,idx);
  switch(pTVar1->tt_ & 0x3f) {
  case 4:
    L_local = (lua_State *)(long)(char)(pTVar1->value_).f[0xb];
    break;
  case 5:
    L_local = (lua_State *)luaH_getn((Table *)(pTVar1->value_).gc);
    break;
  default:
    L_local = (lua_State *)0x0;
    break;
  case 7:
    L_local = *(lua_State **)((pTVar1->value_).f + 0x10);
    break;
  case 0x14:
    L_local = *(lua_State **)((pTVar1->value_).f + 0x10);
  }
  return (lua_Unsigned)L_local;
}

Assistant:

LUA_API lua_Unsigned lua_rawlen (lua_State *L, int idx) {
  const TValue *o = index2value(L, idx);
  switch (ttypetag(o)) {
    case LUA_VSHRSTR: return cast(lua_Unsigned, tsvalue(o)->shrlen);
    case LUA_VLNGSTR: return cast(lua_Unsigned, tsvalue(o)->u.lnglen);
    case LUA_VUSERDATA: return cast(lua_Unsigned, uvalue(o)->len);
    case LUA_VTABLE: return luaH_getn(hvalue(o));
    default: return 0;
  }
}